

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParsePubidLiteral(xmlParserCtxtPtr ctxt)

{
  ulong uVar1;
  byte bVar2;
  xmlParserInputState xVar3;
  xmlChar *pxVar4;
  xmlParserInputPtr pxVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  xmlChar *pxVar10;
  byte bVar11;
  
  xVar3 = ctxt->instate;
  if (ctxt->progressive == 0) {
    pxVar5 = ctxt->input;
    if ((500 < (long)pxVar5->cur - (long)pxVar5->base) &&
       ((long)pxVar5->end - (long)pxVar5->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  bVar11 = *ctxt->input->cur;
  if (bVar11 != 0x22) {
    if (bVar11 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    bVar11 = 0x27;
  }
  xmlNextChar(ctxt);
  pxVar4 = (xmlChar *)(*xmlMallocAtomic)(100);
  if (pxVar4 == (xmlChar *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_PUBLIC_LITERAL;
  bVar2 = *ctxt->input->cur;
  uVar9 = (ulong)bVar2;
  if ((bVar11 == bVar2) || (""[uVar9] == '\0')) {
    *pxVar4 = '\0';
  }
  else {
    iVar7 = 100;
    iVar8 = 0;
    uVar6 = 0;
    pxVar10 = pxVar4;
    do {
      uVar1 = uVar6 + 1;
      pxVar4 = pxVar10;
      if ((long)iVar7 <= (long)uVar1) {
        if ((50000 < iVar7) && ((ctxt->options & 0x80000) == 0)) {
          xmlFatalErr(ctxt,XML_ERR_NAME_TOO_LONG,"Public ID");
          goto LAB_0015e04f;
        }
        iVar7 = iVar7 * 2;
        pxVar4 = (xmlChar *)(*xmlRealloc)(pxVar10,(long)iVar7);
        if (pxVar4 == (xmlChar *)0x0) {
          xmlErrMemory(ctxt,(char *)0x0);
          (*xmlFree)(pxVar10);
          return (xmlChar *)0x0;
        }
      }
      pxVar4[uVar6] = (xmlChar)uVar9;
      if (iVar8 < 0x32) {
        iVar8 = iVar8 + 1;
      }
      else {
        if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
          xmlGROW(ctxt);
        }
        iVar8 = 0;
        if (ctxt->instate == XML_PARSER_EOF) {
LAB_0015e04f:
          (*xmlFree)(pxVar4);
          return (xmlChar *)0x0;
        }
      }
      xmlNextChar(ctxt);
      pxVar5 = ctxt->input;
      bVar2 = *pxVar5->cur;
      if (bVar2 == 0) {
        if (ctxt->progressive == 0) {
          if ((long)pxVar5->end - (long)pxVar5->cur < 0xfa) {
            xmlGROW(ctxt);
            pxVar5 = ctxt->input;
            if (ctxt->progressive != 0) goto LAB_0015df07;
          }
          if ((500 < (long)pxVar5->cur - (long)pxVar5->base) &&
             ((long)pxVar5->end - (long)pxVar5->cur < 500)) {
            xmlSHRINK(ctxt);
            pxVar5 = ctxt->input;
          }
        }
LAB_0015df07:
        bVar2 = *pxVar5->cur;
      }
      uVar9 = (ulong)bVar2;
    } while ((bVar11 != bVar2) && (uVar6 = uVar1, pxVar10 = pxVar4, ""[uVar9] != '\0'));
    pxVar4[uVar1 & 0xffffffff] = '\0';
  }
  if (bVar11 == bVar2) {
    xmlNextChar(ctxt);
  }
  else {
    xmlFatalErr(ctxt,XML_ERR_LITERAL_NOT_FINISHED,(char *)0x0);
  }
  ctxt->instate = xVar3;
  return pxVar4;
}

Assistant:

xmlChar *
xmlParsePubidLiteral(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    xmlChar cur;
    xmlChar stop;
    int count = 0;
    xmlParserInputState oldstate = ctxt->instate;

    SHRINK;
    if (RAW == '"') {
        NEXT;
	stop = '"';
    } else if (RAW == '\'') {
        NEXT;
	stop = '\'';
    } else {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    ctxt->instate = XML_PARSER_PUBLIC_LITERAL;
    cur = CUR;
    while ((IS_PUBIDCHAR_CH(cur)) && (cur != stop)) { /* checked */
	if (len + 1 >= size) {
	    xmlChar *tmp;

            if ((size > XML_MAX_NAME_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlFatalErr(ctxt, XML_ERR_NAME_TOO_LONG, "Public ID");
                xmlFree(buf);
                return(NULL);
            }
	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
		xmlFree(buf);
		return(NULL);
	    }
	    buf = tmp;
	}
	buf[len++] = cur;
	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		return(NULL);
            }
	}
	NEXT;
	cur = CUR;
	if (cur == 0) {
	    GROW;
	    SHRINK;
	    cur = CUR;
	}
    }
    buf[len] = 0;
    if (cur != stop) {
	xmlFatalErr(ctxt, XML_ERR_LITERAL_NOT_FINISHED, NULL);
    } else {
	NEXT;
    }
    ctxt->instate = oldstate;
    return(buf);
}